

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_attribute __thiscall
pugi::xml_node::insert_copy_before(xml_node *this,xml_attribute *proto,xml_attribute *attr)

{
  ulong uVar1;
  xml_node_struct *pxVar2;
  xml_allocator *this_00;
  xml_attribute_struct *pxVar3;
  xml_attribute_struct *pxVar4;
  xml_memory_page *in_RAX;
  xml_attribute_struct *pxVar5;
  xml_attribute_struct **ppxVar6;
  uint uVar7;
  xml_memory_page *local_28;
  
  uVar7 = 0;
  if (proto->_attr != (xml_attribute_struct *)0x0) {
    pxVar2 = this->_root;
    if (pxVar2 != (xml_node_struct *)0x0) {
      uVar7 = (uint)pxVar2->header & 0xf;
    }
    if (((uVar7 == 7) || (uVar7 == 2)) && (attr->_attr != (xml_attribute_struct *)0x0)) {
      ppxVar6 = &pxVar2->first_attribute;
      do {
        pxVar5 = *ppxVar6;
        if (pxVar5 == attr->_attr) break;
        ppxVar6 = &pxVar5->next_attribute;
      } while (pxVar5 != (xml_attribute_struct *)0x0);
      if (pxVar5 != (xml_attribute_struct *)0x0) {
        if (pxVar2 == (xml_node_struct *)0x0) {
          __assert_fail("object",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                        ,0x486,
                        "xml_allocator &pugi::impl::(anonymous namespace)::get_allocator(const Object *) [Object = pugi::xml_node_struct]"
                       );
        }
        this_00 = *(xml_allocator **)((long)pxVar2 - (pxVar2->header >> 8));
        uVar1 = this_00->_busy_size + 0x28;
        if (uVar1 < 0x7fd9) {
          local_28 = this_00->_root;
          pxVar5 = (xml_attribute_struct *)((long)&local_28[1].allocator + this_00->_busy_size);
          this_00->_busy_size = uVar1;
        }
        else {
          local_28 = in_RAX;
          pxVar5 = (xml_attribute_struct *)
                   impl::anon_unknown_0::xml_allocator::allocate_memory_oob(this_00,0x28,&local_28);
        }
        if (pxVar5 == (xml_attribute_struct *)0x0) {
          pxVar5 = (xml_attribute_struct *)0x0;
        }
        else {
          pxVar5->name = (char_t *)0x0;
          pxVar5->value = (char_t *)0x0;
          pxVar5->prev_attribute_c = (xml_attribute_struct *)0x0;
          pxVar5->next_attribute = (xml_attribute_struct *)0x0;
          pxVar5->header = ((long)pxVar5 - (long)local_28) * 0x100;
        }
        if (pxVar5 != (xml_attribute_struct *)0x0) {
          pxVar3 = attr->_attr;
          pxVar4 = pxVar3->prev_attribute_c;
          ppxVar6 = &this->_root->first_attribute;
          if (pxVar4->next_attribute != (xml_attribute_struct *)0x0) {
            ppxVar6 = &pxVar4->next_attribute;
          }
          *ppxVar6 = pxVar5;
          pxVar5->prev_attribute_c = pxVar4;
          pxVar5->next_attribute = pxVar3;
          pxVar3->prev_attribute_c = pxVar5;
          impl::anon_unknown_0::node_copy_attribute(pxVar5,proto->_attr);
          return (xml_attribute)pxVar5;
        }
      }
    }
  }
  return (xml_attribute)(xml_attribute_struct *)0x0;
}

Assistant:

PUGI__FN xml_attribute xml_node::insert_copy_before(const xml_attribute& proto, const xml_attribute& attr)
	{
		if (!proto) return xml_attribute();
		if (!impl::allow_insert_attribute(type())) return xml_attribute();
		if (!attr || !impl::is_attribute_of(attr._attr, _root)) return xml_attribute();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_attribute();

		xml_attribute a(impl::allocate_attribute(alloc));
		if (!a) return xml_attribute();

		impl::insert_attribute_before(a._attr, attr._attr, _root);
		impl::node_copy_attribute(a._attr, proto._attr);

		return a;
	}